

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::print_const_value
          (t_java_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  int *piVar1;
  t_field *ptVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  t_type *ptVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_type *ptVar10;
  pointer pptVar11;
  char *pcVar12;
  pointer pptVar13;
  string v2;
  string cap_name;
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  string val_1;
  string local_50;
  
  ptVar6 = t_type::get_true_type(type);
  t_generator::indent((t_generator *)this,out);
  if (!defval) {
    pcVar12 = "public static final ";
    if (in_static) {
      pcVar12 = "";
    }
    poVar7 = std::operator<<(out,pcVar12);
    type_name_abi_cxx11_(&v2,this,ptVar6,false,false,false,false);
    poVar7 = std::operator<<(poVar7,(string *)&v2);
    std::operator<<(poVar7," ");
    std::__cxx11::string::~string((string *)&v2);
  }
  iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[5])(ptVar6);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[10])(ptVar6);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xb])(ptVar6);
      if (((char)iVar5 != '\0') ||
         (iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xc])(ptVar6), (char)iVar5 != '\0')) {
        std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
                  (&fields,(vector<t_field_*,_std::allocator<t_field_*>_> *)(ptVar6 + 1));
        std::
        __sort<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,__gnu_cxx::__ops::_Iter_comp_iter<t_field::key_compare>>
                  (fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        poVar7 = std::operator<<(out,(string *)name);
        poVar7 = std::operator<<(poVar7," = new ");
        type_name_abi_cxx11_(&v2,this,ptVar6,false,true,false,false);
        poVar7 = std::operator<<(poVar7,(string *)&v2);
        poVar7 = std::operator<<(poVar7,"();");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&v2);
        if (!in_static) {
          poVar7 = t_generator::indent((t_generator *)this,out);
          poVar7 = std::operator<<(poVar7,"static {");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          if ((_Rb_tree_header *)p_Var8 == &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header) {
            if (!in_static) {
              piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
              *piVar1 = *piVar1 + -1;
              poVar7 = t_generator::indent((t_generator *)this,out);
              poVar7 = std::operator<<(poVar7,"}");
              std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
            }
            std::operator<<(out,(string *)&::endl_abi_cxx11_);
            std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
                      (&fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>);
            return;
          }
          ptVar10 = (t_type *)0x0;
          for (pptVar13 = fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pptVar13 !=
              fields.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
            ptVar2 = *pptVar13;
            std::__cxx11::string::string((string *)&v2,(string *)(*(long *)(p_Var8 + 1) + 0x48));
            _Var3 = std::operator==(&ptVar2->name_,&v2);
            std::__cxx11::string::~string((string *)&v2);
            if (_Var3) {
              ptVar10 = (*pptVar13)->type_;
            }
          }
          if (ptVar10 == (t_type *)0x0) break;
          render_const_value_abi_cxx11_(&v2,this,out,ptVar10,(t_const_value *)p_Var8[1]._M_parent);
          poVar7 = t_generator::indent((t_generator *)this,out);
          poVar7 = std::operator<<(poVar7,(string *)name);
          std::operator<<(poVar7,".");
          std::__cxx11::string::string((string *)&local_50,(string *)(*(long *)(p_Var8 + 1) + 0x48))
          ;
          get_cap_name(&cap_name,this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          poVar7 = std::operator<<(out,"set");
          poVar7 = std::operator<<(poVar7,(string *)&cap_name);
          poVar7 = std::operator<<(poVar7,"(");
          poVar7 = std::operator<<(poVar7,(string *)&v2);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&cap_name);
          std::__cxx11::string::~string((string *)&v2);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        }
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[3])();
        std::operator+(&cap_name,"type error: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar5));
        std::operator+(&v2,&cap_name," has no field ");
        std::__cxx11::string::string((string *)&val_1,(string *)(*(long *)(p_Var8 + 1) + 0x48));
        std::operator+(pbVar9,&v2,&val_1);
        __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[0x10])(ptVar6);
      if ((char)iVar5 == '\0') {
        iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xe])(ptVar6);
        if (((char)iVar5 == '\0') &&
           (iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xf])(ptVar6), (char)iVar5 == '\0')) {
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          iVar5 = (*(ptVar6->super_t_doc)._vptr_t_doc[3])(ptVar6);
          std::operator+(pbVar9,"compiler error: no const of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_00,iVar5));
          __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        bVar4 = is_enum_set(this,ptVar6);
        poVar7 = std::operator<<(out,(string *)name);
        if (bVar4) {
          poVar7 = std::operator<<(poVar7," = ");
          type_name_abi_cxx11_(&v2,this,ptVar6,false,true,true,false);
          poVar7 = std::operator<<(poVar7,(string *)&v2);
          poVar7 = std::operator<<(poVar7,".noneOf(");
          inner_enum_type_name_abi_cxx11_(&cap_name,this,ptVar6);
          poVar7 = std::operator<<(poVar7,(string *)&cap_name);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&cap_name);
        }
        else {
          poVar7 = std::operator<<(poVar7," = new ");
          type_name_abi_cxx11_(&v2,this,ptVar6,false,true,false,false);
          poVar7 = std::operator<<(poVar7,(string *)&v2);
          poVar7 = std::operator<<(poVar7,"();");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        }
        std::__cxx11::string::~string((string *)&v2);
        if (!in_static) {
          poVar7 = t_generator::indent((t_generator *)this,out);
          poVar7 = std::operator<<(poVar7,"static {");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        (*(ptVar6->super_t_doc)._vptr_t_doc[0xe])(ptVar6);
        ptVar6 = *(t_type **)&ptVar6[1].super_t_doc.has_doc_;
        for (pptVar11 = (value->listVal_).
                        super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            pptVar11 !=
            (value->listVal_).super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
          render_const_value_abi_cxx11_(&v2,this,out,ptVar6,*pptVar11);
          poVar7 = t_generator::indent((t_generator *)this,out);
          poVar7 = std::operator<<(poVar7,(string *)name);
          poVar7 = std::operator<<(poVar7,".add(");
          poVar7 = std::operator<<(poVar7,(string *)&v2);
          poVar7 = std::operator<<(poVar7,");");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&v2);
        }
        if (!in_static) {
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar7 = t_generator::indent((t_generator *)this,out);
          poVar7 = std::operator<<(poVar7,"}");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        return;
      }
      v2._M_dataplus._M_p = (pointer)&v2.field_2;
      v2._M_string_length = 0;
      v2.field_2._M_local_buf[0] = '\0';
      bVar4 = is_enum_map(this,ptVar6);
      if (bVar4) {
        inner_enum_type_name_abi_cxx11_(&cap_name,this,ptVar6);
        std::__cxx11::string::operator=((string *)&v2,(string *)&cap_name);
        std::__cxx11::string::~string((string *)&cap_name);
      }
      poVar7 = std::operator<<(out,(string *)name);
      poVar7 = std::operator<<(poVar7," = new ");
      type_name_abi_cxx11_(&cap_name,this,ptVar6,false,true,false,false);
      poVar7 = std::operator<<(poVar7,(string *)&cap_name);
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = std::operator<<(poVar7,(string *)&v2);
      poVar7 = std::operator<<(poVar7,");");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&cap_name);
      if (!in_static) {
        poVar7 = t_generator::indent((t_generator *)this,out);
        poVar7 = std::operator<<(poVar7,"static {");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
      ptVar10 = *(t_type **)&ptVar6[1].super_t_doc.has_doc_;
      ptVar6 = *(t_type **)&ptVar6[1].annotations_._M_t._M_impl;
      for (p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        render_const_value_abi_cxx11_(&cap_name,this,out,ptVar10,*(t_const_value **)(p_Var8 + 1));
        render_const_value_abi_cxx11_(&val_1,this,out,ptVar6,(t_const_value *)p_Var8[1]._M_parent);
        poVar7 = t_generator::indent((t_generator *)this,out);
        poVar7 = std::operator<<(poVar7,(string *)name);
        poVar7 = std::operator<<(poVar7,".put(");
        poVar7 = std::operator<<(poVar7,(string *)&cap_name);
        poVar7 = std::operator<<(poVar7,", ");
        poVar7 = std::operator<<(poVar7,(string *)&val_1);
        poVar7 = std::operator<<(poVar7,");");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&val_1);
        std::__cxx11::string::~string((string *)&cap_name);
      }
      if (!in_static) {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar7 = t_generator::indent((t_generator *)this,out);
        poVar7 = std::operator<<(poVar7,"}");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      }
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar7 = std::operator<<(out,(string *)name);
      poVar7 = std::operator<<(poVar7," = ");
      render_const_value_abi_cxx11_(&v2,this,out,ptVar6,value);
      poVar7 = std::operator<<(poVar7,(string *)&v2);
      poVar7 = std::operator<<(poVar7,";");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    render_const_value_abi_cxx11_(&v2,this,out,ptVar6,value);
    poVar7 = std::operator<<(out,(string *)name);
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = std::operator<<(poVar7,(string *)&v2);
    poVar7 = std::operator<<(poVar7,";");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&v2);
  return;
}

Assistant:

void t_java_generator::print_const_value(std::ostream& out,
                                         string name,
                                         t_type* type,
                                         t_const_value* value,
                                         bool in_static,
                                         bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "" : "public static final ") << type_name(type) << " ";
  }
  if (type->is_base_type()) {
    string v2 = render_const_value(out, type, value);
    out << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    out << name << " = " << render_const_value(out, type, value) << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& unsorted_fields = ((t_struct*)type)->get_members();
    vector<t_field*> fields = unsorted_fields;
    std::sort(fields.begin(), fields.end(), t_field::key_compare());
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << name << " = new " << type_name(type, false, true) << "();" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, field_type, v_iter->second);
      indent(out) << name << ".";
      std::string cap_name = get_cap_name(v_iter->first->get_string());
      out << "set" << cap_name << "(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_map()) {
    std::string constructor_args;
    if (is_enum_map(type)) {
      constructor_args = inner_enum_type_name(type);
    }
    out << name << " = new " << type_name(type, false, true) << "(" << constructor_args << ");" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, ktype, v_iter->first);
      string val = render_const_value(out, vtype, v_iter->second);
      indent(out) << name << ".put(" << key << ", " << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (is_enum_set(type)) {
      out << name << " = " << type_name(type, false, true, true) << ".noneOf(" << inner_enum_type_name(type) << ");" << endl;
    } else {
      out << name << " = new " << type_name(type, false, true) << "();" << endl;
    }
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, etype, *v_iter);
      indent(out) << name << ".add(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}